

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

char read_u32(archive_read *a,uint32_t *pvalue)

{
  wchar_t wVar1;
  uint32_t uVar2;
  uint8_t *local_28;
  uint8_t *p;
  uint32_t *pvalue_local;
  archive_read *a_local;
  
  p = (uint8_t *)pvalue;
  pvalue_local = (uint32_t *)a;
  wVar1 = read_ahead(a,4,&local_28);
  if (wVar1 == L'\0') {
    a_local._7_1_ = false;
  }
  else {
    uVar2 = archive_le32dec(local_28);
    *(uint32_t *)p = uVar2;
    wVar1 = consume((archive_read *)pvalue_local,4);
    a_local._7_1_ = wVar1 == L'\0';
  }
  return a_local._7_1_;
}

Assistant:

static char read_u32(struct archive_read* a, uint32_t* pvalue) {
	const uint8_t* p;
	if(!read_ahead(a, 4, &p))
		return 0;

	*pvalue = archive_le32dec(p);
	return ARCHIVE_OK == consume(a, 4);
}